

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pockle.c
# Opt level: O2

PockleStatus pockle_insert(Pockle *pockle,mp_int *p,mp_int **factors,size_t nfactors,mp_int *w)

{
  PockleStatus extraout_EAX;
  PocklePrimeRecord *e;
  mp_int *pmVar1;
  PocklePrimeRecord *pPVar2;
  PocklePrimeRecord **ppPVar3;
  size_t i;
  size_t sVar4;
  
  e = (PocklePrimeRecord *)safemalloc(1,0x28,0);
  pmVar1 = mp_copy(p);
  e->prime = pmVar1;
  pPVar2 = (PocklePrimeRecord *)add234(pockle->tree,e);
  if (e != pPVar2) {
    mp_free(e->prime);
    safefree(e);
    return extraout_EAX;
  }
  if (w == (mp_int *)0x0) {
    e->factors = (PocklePrimeRecord **)0x0;
    e->nfactors = 0;
    e->witness = (mp_int *)0x0;
  }
  else {
    sVar4 = 0;
    ppPVar3 = (PocklePrimeRecord **)safemalloc(nfactors,8,0);
    e->factors = ppPVar3;
    while (nfactors != sVar4) {
      pPVar2 = (PocklePrimeRecord *)find234(pockle->tree,factors[sVar4],ppr_find);
      e->factors[sVar4] = pPVar2;
      ppPVar3 = e->factors + sVar4;
      sVar4 = sVar4 + 1;
      if (*ppPVar3 == (PocklePrimeRecord *)0x0) {
        __assert_fail("pr->factors[i]",
                      "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/keygen/pockle.c"
                      ,0x4c,
                      "PockleStatus pockle_insert(Pockle *, mp_int *, mp_int **, size_t, mp_int *)")
        ;
      }
    }
    e->nfactors = nfactors;
    pmVar1 = mp_copy(w);
    e->witness = pmVar1;
  }
  sVar4 = pockle->nlist;
  e->index = sVar4;
  ppPVar3 = (PocklePrimeRecord **)safegrowarray(pockle->list,&pockle->listsize,8,sVar4,1,false);
  pockle->list = ppPVar3;
  sVar4 = pockle->nlist;
  pockle->nlist = sVar4 + 1;
  ppPVar3[sVar4] = e;
  return (PockleStatus)ppPVar3;
}

Assistant:

static PockleStatus pockle_insert(Pockle *pockle, mp_int *p, mp_int **factors,
                                  size_t nfactors, mp_int *w)
{
    PocklePrimeRecord *pr = snew(PocklePrimeRecord);
    pr->prime = mp_copy(p);

    PocklePrimeRecord *found = add234(pockle->tree, pr);
    if (pr != found) {
        /* it was already in there */
        mp_free(pr->prime);
        sfree(pr);
        return POCKLE_OK;
    }

    if (w) {
        pr->factors = snewn(nfactors, PocklePrimeRecord *);
        for (size_t i = 0; i < nfactors; i++) {
            pr->factors[i] = find234(pockle->tree, factors[i], ppr_find);
            assert(pr->factors[i]);
        }
        pr->nfactors = nfactors;
        pr->witness = mp_copy(w);
    } else {
        pr->factors = NULL;
        pr->nfactors = 0;
        pr->witness = NULL;
    }
    pr->index = pockle->nlist;

    sgrowarray(pockle->list, pockle->listsize, pockle->nlist);
    pockle->list[pockle->nlist++] = pr;
    return POCKLE_OK;
}